

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_scaleStats(uint *table,U32 lastEltIndex,U32 logTarget)

{
  U32 total;
  uint uVar1;
  U32 UVar2;
  uint uVar3;
  size_t n;
  ulong uVar4;
  
  uVar1 = 0;
  uVar4 = 0;
  do {
    uVar1 = uVar1 + table[uVar4];
    uVar4 = uVar4 + 1;
  } while (lastEltIndex + 1 != uVar4);
  uVar3 = uVar1 >> ((byte)logTarget & 0x1f);
  if (uVar3 < 2) {
    return uVar1;
  }
  UVar2 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> UVar2 == 0; UVar2 = UVar2 - 1) {
    }
  }
  UVar2 = ZSTD_downscaleStats(table,lastEltIndex,UVar2,base_1guaranteed);
  return UVar2;
}

Assistant:

static U32 ZSTD_scaleStats(unsigned* table, U32 lastEltIndex, U32 logTarget)
{
    U32 const prevsum = sum_u32(table, lastEltIndex+1);
    U32 const factor = prevsum >> logTarget;
    DEBUGLOG(5, "ZSTD_scaleStats (nbElts=%u, target=%u)", (unsigned)lastEltIndex+1, (unsigned)logTarget);
    assert(logTarget < 30);
    if (factor <= 1) return prevsum;
    return ZSTD_downscaleStats(table, lastEltIndex, ZSTD_highbit32(factor), base_1guaranteed);
}